

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

GLuint QOpenGLTexture::boundTextureId(BindingTarget target)

{
  long lVar1;
  long *plVar2;
  GLuint GVar3;
  long in_FS_OFFSET;
  GLint textureId;
  GLuint local_38 [6];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = QOpenGLContext::currentContext();
  if (lVar1 == 0) {
    local_38[0] = 2;
    local_38[5] = 0;
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[3] = 0;
    local_38[4] = 0;
    local_20 = "default";
    GVar3 = 0;
    QMessageLogger::warning
              ((char *)local_38,"QOpenGLTexture::boundTextureId() requires a valid current context")
    ;
  }
  else {
    local_38[0] = 0;
    plVar2 = (long *)QOpenGLContext::functions();
    (**(code **)(*plVar2 + 200))(target,local_38);
    GVar3 = local_38[0];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return GVar3;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGLTexture::boundTextureId(BindingTarget target)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::boundTextureId() requires a valid current context");
        return 0;
    }

    GLint textureId = 0;
    ctx->functions()->glGetIntegerv(target, &textureId);
    return static_cast<GLuint>(textureId);
}